

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

void ikcp_update(ikcpcb *kcp,IUINT32 current)

{
  int iVar1;
  IUINT32 IVar2;
  IUINT32 IVar3;
  
  kcp->current = current;
  if (kcp->updated == 0) {
    kcp->updated = 1;
    kcp->ts_flush = current;
  }
  iVar1 = current - kcp->ts_flush;
  if ((long)iVar1 - 10000U < 0xffffffffffffb1e0) {
    kcp->ts_flush = current;
    iVar1 = 0;
  }
  if (-1 < iVar1) {
    IVar3 = kcp->ts_flush + kcp->interval;
    IVar2 = kcp->interval + current;
    if ((int)(current - IVar3) < 0) {
      IVar2 = IVar3;
    }
    kcp->ts_flush = IVar2;
    ikcp_flush(kcp);
    return;
  }
  return;
}

Assistant:

void ikcp_update(ikcpcb *kcp, IUINT32 current)
{
	IINT32 slap;

	kcp->current = current;

	if (kcp->updated == 0) {
		kcp->updated = 1;
		kcp->ts_flush = kcp->current;
	}

	slap = _itimediff(kcp->current, kcp->ts_flush);

	if (slap >= 10000 || slap < -10000) {
		kcp->ts_flush = kcp->current;
		slap = 0;
	}

	if (slap >= 0) {
		kcp->ts_flush += kcp->interval;
		if (_itimediff(kcp->current, kcp->ts_flush) >= 0) {
			kcp->ts_flush = kcp->current + kcp->interval;
		}
		ikcp_flush(kcp);
	}
}